

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

void xmlXIncludeErr(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node,int error,char *msg,xmlChar *extra)

{
  xmlStructuredErrorFunc schannel_00;
  int iVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  void *pvStack_58;
  int res;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  xmlChar *extra_local;
  char *msg_local;
  int error_local;
  xmlNodePtr node_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  data = (void *)0x0;
  if (error == 2) {
    xmlXIncludeErrMemory(ctxt);
  }
  else if (ctxt->fatalErr == 0) {
    ctxt->nbErrors = ctxt->nbErrors + 1;
    schannel_00 = ctxt->errorHandler;
    pvStack_58 = ctxt->errorCtxt;
    if (schannel_00 == (xmlStructuredErrorFunc)0x0) {
      pp_Var2 = __xmlGenericError();
      data = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      pvStack_58 = *ppvVar3;
    }
    iVar1 = xmlRaiseError(schannel_00,(xmlGenericErrorFunc)data,pvStack_58,ctxt,node,0xb,error,
                          XML_ERR_ERROR,(char *)0x0,0,(char *)extra,(char *)0x0,(char *)0x0,0,0,msg,
                          extra);
    if (iVar1 < 0) {
      ctxt->errNo = 2;
      ctxt->fatalErr = 1;
    }
    else {
      ctxt->errNo = error;
      iVar1 = xmlIsCatastrophicError(3,error);
      if (iVar1 != 0) {
        ctxt->fatalErr = 1;
      }
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlXIncludeErr(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node, int error,
               const char *msg, const xmlChar *extra)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    int res;

    if (error == XML_ERR_NO_MEMORY) {
        xmlXIncludeErrMemory(ctxt);
        return;
    }